

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cdash_reporter_tests.c
# Opt level: O3

TestSuite * cdash_reporter_tests(void)

{
  TestSuite *pTVar1;
  
  pTVar1 = (TestSuite *)
           create_named_test_suite_
                     ("cdash_reporter_tests",
                      "/workspace/llm4binary/github/license_c_cmakelists/cgreen-devs[P]cgreen/tests/cdash_reporter_tests.c"
                      ,0xb3);
  set_setup(pTVar1,setup_cdash_reporter_tests);
  add_test_(pTVar1,"will_report_nothing_for_suites",
            &CgreenSpec__CDashReporter__will_report_nothing_for_suites__);
  add_test_(pTVar1,"will_report_passed_for_test_with_one_pass",
            &CgreenSpec__CDashReporter__will_report_passed_for_test_with_one_pass__);
  add_test_(pTVar1,"will_report_failed_once_for_each_fail",
            &CgreenSpec__CDashReporter__will_report_failed_once_for_each_fail__);
  add_test_(pTVar1,"will_report_non_finishing_test",
            &CgreenSpec__CDashReporter__will_report_non_finishing_test__);
  set_teardown(pTVar1,teardown_cdash_reporter_tests);
  return pTVar1;
}

Assistant:

TestSuite *cdash_reporter_tests(void) {
    TestSuite *suite = create_test_suite();
    set_setup(suite, setup_cdash_reporter_tests);

    add_test_with_context(suite, CDashReporter, will_report_nothing_for_suites);
    add_test_with_context(suite, CDashReporter, will_report_passed_for_test_with_one_pass);
    add_test_with_context(suite, CDashReporter, will_report_failed_once_for_each_fail);
    add_test_with_context(suite, CDashReporter, will_report_non_finishing_test);
    
    set_teardown(suite, teardown_cdash_reporter_tests);
    return suite;
}